

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O3

Result __thiscall
wabt::BinaryReaderLogging::OnImportTable
          (BinaryReaderLogging *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  Stream *this_00;
  Enum EVar1;
  string local_b8;
  char buf [100];
  
  anon_unknown_25::SPrintLimits(buf,(size_t)elem_limits,(Limits *)module_name._M_len);
  WriteIndent(this);
  this_00 = this->stream_;
  Type::GetName_abi_cxx11_(&local_b8,&elem_type);
  Stream::Writef(this_00,"OnImportTable(import_index: %u, table_index: %u, elem_type: %s, %s)\n",
                 (ulong)import_index,(ulong)table_index,local_b8._M_dataplus._M_p,buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x13])
                    (this->reader_,(ulong)import_index,(Limits *)module_name._M_len,
                     module_name._M_str,field_name._M_len,field_name._M_str,(ulong)table_index,
                     elem_type,elem_limits);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImportTable(Index import_index,
                                          std::string_view module_name,
                                          std::string_view field_name,
                                          Index table_index,
                                          Type elem_type,
                                          const Limits* elem_limits) {
  char buf[100];
  SPrintLimits(buf, sizeof(buf), elem_limits);
  LOGF("OnImportTable(import_index: %" PRIindex ", table_index: %" PRIindex
       ", elem_type: %s, %s)\n",
       import_index, table_index, elem_type.GetName().c_str(), buf);
  return reader_->OnImportTable(import_index, module_name, field_name,
                                table_index, elem_type, elem_limits);
}